

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O2

void __thiscall cppjieba::HMMModel::LoadModel(HMMModel *this,string *filePath)

{
  double dVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pbVar5;
  double (*padVar6) [4];
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t j;
  ulong uVar10;
  allocator<char> local_419;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp2;
  Logger local_3b8;
  ifstream ifile;
  
  std::ifstream::ifstream(&ifile,(filePath->_M_dataplus)._M_p,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x24);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [ifile.is_open()");
    poVar4 = std::operator<<(poVar4,"] false. ");
    poVar4 = std::operator<<(poVar4,"open ");
    poVar4 = std::operator<<(poVar4,(string *)filePath);
    std::operator<<(poVar4," failed");
    limonp::Logger::~Logger(&local_3b8);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  tmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = GetLine(this,&ifile,&line);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x29);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8," ",&local_419);
  limonp::Split(&line,&tmp,(string *)&local_3b8,0xffffffffffffffff);
  std::__cxx11::string::~string((string *)&local_3b8);
  if ((long)tmp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)tmp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    uVar8 = 4;
  }
  else {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x2b);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [tmp.size() == STATUS_SUM");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
    uVar8 = (long)tmp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)tmp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  pbVar5 = tmp.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
    dVar1 = atof((pbVar5->_M_dataplus)._M_p);
    this->startProb[uVar10] = dVar1;
    pbVar5 = pbVar5 + 1;
  }
  padVar6 = this->transProb;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    bVar3 = GetLine(this,&ifile,&line);
    if (!bVar3) {
      limonp::Logger::Logger
                (&local_3b8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
                 ,0x32);
      poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [GetLine(ifile, line)");
      std::operator<<(poVar4,"] false. ");
      limonp::Logger::~Logger(&local_3b8);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8," ",&local_419);
    limonp::Split(&line,&tmp,(string *)&local_3b8,0xffffffffffffffff);
    std::__cxx11::string::~string((string *)&local_3b8);
    if ((long)tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x80) {
      limonp::Logger::Logger
                (&local_3b8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
                 ,0x34);
      poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [tmp.size() == STATUS_SUM");
      std::operator<<(poVar4,"] false. ");
      limonp::Logger::~Logger(&local_3b8);
    }
    pbVar5 = tmp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
      dVar1 = atof(*(char **)((long)&(pbVar5->_M_dataplus)._M_p + lVar7 * 4));
      *(double *)((long)*padVar6 + lVar7) = dVar1;
    }
    padVar6 = padVar6 + 1;
  }
  bVar3 = GetLine(this,&ifile,&line);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x3b);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  bVar3 = LoadEmitProb(this,&line,&this->emitProbB);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x3c);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [LoadEmitProb(line, emitProbB)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  bVar3 = GetLine(this,&ifile,&line);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x3f);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  bVar3 = LoadEmitProb(this,&line,&this->emitProbE);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x40);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [LoadEmitProb(line, emitProbE)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  bVar3 = GetLine(this,&ifile,&line);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x43);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  bVar3 = LoadEmitProb(this,&line,&this->emitProbM);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x44);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [LoadEmitProb(line, emitProbM)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  bVar3 = GetLine(this,&ifile,&line);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x47);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  bVar3 = LoadEmitProb(this,&line,&this->emitProbS);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/HMMModel.hpp"
               ,0x48);
    poVar4 = std::operator<<((ostream *)&local_3b8,"exp: [LoadEmitProb(line, emitProbS)");
    std::operator<<(poVar4,"] false. ");
    limonp::Logger::~Logger(&local_3b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tmp2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tmp);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&ifile);
  return;
}

Assistant:

void LoadModel(const string& filePath) {
    ifstream ifile(filePath.c_str());
    XCHECK(ifile.is_open()) << "open " << filePath << " failed";
    string line;
    vector<string> tmp;
    vector<string> tmp2;
    //Load startProb
    XCHECK(GetLine(ifile, line));
    Split(line, tmp, " ");
    XCHECK(tmp.size() == STATUS_SUM);
    for (size_t j = 0; j< tmp.size(); j++) {
      startProb[j] = atof(tmp[j].c_str());
    }

    //Load transProb
    for (size_t i = 0; i < STATUS_SUM; i++) {
      XCHECK(GetLine(ifile, line));
      Split(line, tmp, " ");
      XCHECK(tmp.size() == STATUS_SUM);
      for (size_t j =0; j < STATUS_SUM; j++) {
        transProb[i][j] = atof(tmp[j].c_str());
      }
    }

    //Load emitProbB
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbB));

    //Load emitProbE
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbE));

    //Load emitProbM
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbM));

    //Load emitProbS
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbS));
  }